

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

value_type __thiscall QList<QObject_*>::takeFirst(QList<QObject_*> *this)

{
  QObject **ppQVar1;
  QPodArrayOps<QObject_*> *this_00;
  QArrayDataPointer<QObject_*> *in_RDI;
  value_type v;
  QList<QObject_*> *in_stack_fffffffffffffff0;
  QObject *pQVar2;
  
  ppQVar1 = first(in_stack_fffffffffffffff0);
  pQVar2 = *ppQVar1;
  this_00 = (QPodArrayOps<QObject_*> *)QArrayDataPointer<QObject_*>::operator->(in_RDI);
  QtPrivate::QPodArrayOps<QObject_*>::eraseFirst(this_00);
  return pQVar2;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }